

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O3

void alf_one_blk_fix(pel *dst,int i_dst,pel *src,int i_src,int lcu_width,int lcu_height,int *coef,
                    int sample_bit_depth)

{
  long lVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  pel pVar7;
  uint uVar8;
  long lVar9;
  
  uVar8 = ~(-1 << ((byte)sample_bit_depth & 0x1f));
  bVar2 = *src;
  lVar6 = (long)i_src;
  if (bVar2 != src[-1]) {
    uVar5 = (uint)bVar2;
    uVar4 = (int)(((uint)src[-3] + (uint)src[3]) * coef[5] +
                  (uint)bVar2 * coef[8] + ((uint)src[-2] + (uint)src[2]) * coef[6] +
                  ((uint)src[-1] + (uint)src[1]) * coef[7] +
                  ((uint)src[lVar6 + -1] + (uint)src[1]) * coef[4] + (src[lVar6] + uVar5) * coef[3]
                  + (src[lVar6 + 1] + uVar5) * coef[2] + (src[lVar6 * 2] + uVar5) * coef[1] +
                    (src[lVar6 * 3] + uVar5) * *coef + 0x20) >> 6;
    uVar5 = uVar8;
    if ((int)uVar4 < (int)uVar8) {
      uVar5 = uVar4;
    }
    pVar7 = '\0';
    if (-1 < (int)uVar4) {
      pVar7 = (pel)uVar5;
    }
    *dst = pVar7;
  }
  lVar9 = (long)lcu_width;
  lVar1 = lVar9 + -1;
  bVar2 = src[lVar9 + -1];
  if (bVar2 != src[lVar9]) {
    lVar3 = lVar9 + -1;
    uVar5 = (uint)bVar2;
    uVar4 = (int)(((uint)src[lVar9 + -4] + (uint)src[lVar9 + 2]) * coef[5] +
                  (uint)bVar2 * coef[8] +
                  ((uint)src[lVar9 + -3] + (uint)src[lVar9 + 1]) * coef[6] +
                  ((uint)src[lVar9] + (uint)src[lVar9 + -2]) * coef[7] +
                  (src[lVar6 + lVar9 + -2] + uVar5) * coef[4] +
                  (src[lVar6 + lVar3] + uVar5) * coef[3] +
                  ((uint)src[lVar6 + lVar9] + (uint)src[lVar9 + -2]) * coef[2] +
                  (src[lVar6 * 2 + lVar3] + uVar5) * coef[1] +
                  (src[lVar6 * 3 + lVar3] + uVar5) * *coef + 0x20) >> 6;
    uVar5 = uVar8;
    if ((int)uVar4 < (int)uVar8) {
      uVar5 = uVar4;
    }
    pVar7 = '\0';
    if (-1 < (int)uVar4) {
      pVar7 = (pel)uVar5;
    }
    dst[lVar1] = pVar7;
  }
  lVar9 = (long)(i_src * (lcu_height + -1));
  bVar2 = src[lVar9];
  if (bVar2 != src[lVar9 + -1]) {
    uVar5 = (uint)bVar2;
    uVar4 = (int)(((uint)src[lVar9 + -3] + (uint)src[lVar9 + 3]) * coef[5] +
                  (uint)bVar2 * coef[8] +
                  ((uint)src[lVar9 + -2] + (uint)src[lVar9 + 2]) * coef[6] +
                  (src[(lVar9 + 1) - lVar6] + uVar5) * coef[4] +
                  ((uint)src[lVar9 + -1] + (uint)src[lVar9 + 1]) * coef[7] +
                  (src[lVar9 - lVar6] + uVar5) * coef[3] +
                  ((uint)(src + (lVar9 - lVar6))[-1] + (uint)src[lVar9 + 1]) * coef[2] +
                  (src[lVar9 - i_src * 2] + uVar5) * coef[1] +
                  (src[lVar9 - i_src * 3] + uVar5) * *coef + 0x20) >> 6;
    uVar5 = uVar8;
    if ((int)uVar4 < (int)uVar8) {
      uVar5 = uVar4;
    }
    pVar7 = '\0';
    if (-1 < (int)uVar4) {
      pVar7 = (pel)uVar5;
    }
    dst[(lcu_height + -1) * i_dst] = pVar7;
  }
  bVar2 = src[lVar1 + lVar9];
  if (bVar2 != src[lVar1 + lVar9 + 1]) {
    lVar3 = lVar1 + lVar9;
    uVar5 = (uint)bVar2;
    uVar5 = (int)(((uint)src[lVar3 + -3] + (uint)src[lVar3 + 3]) * coef[5] +
                  (uint)bVar2 * coef[8] +
                  ((uint)src[lVar3 + -2] + (uint)src[lVar3 + 2]) * coef[6] +
                  ((uint)src[(lVar3 + 1) - lVar6] + (uint)src[lVar3 + -1]) * coef[4] +
                  ((uint)src[lVar1 + lVar9 + 1] + (uint)src[lVar3 + -1]) * coef[7] +
                  (src[lVar3 - lVar6] + uVar5) * coef[3] +
                  ((src + (lVar3 - lVar6))[-1] + uVar5) * coef[2] +
                  (src[lVar3 - i_src * 2] + uVar5) * coef[1] +
                  (src[lVar3 - i_src * 3] + uVar5) * *coef + 0x20) >> 6;
    if ((int)uVar5 < (int)uVar8) {
      uVar8 = uVar5;
    }
    pVar7 = '\0';
    if (-1 < (int)uVar5) {
      pVar7 = (pel)uVar8;
    }
    (dst + (lcu_height + -1) * i_dst)[lVar1] = pVar7;
  }
  return;
}

Assistant:

static void alf_one_blk_fix(pel *dst, int i_dst, pel *src, int i_src,  int lcu_width, int lcu_height, int *coef, int sample_bit_depth)
{
    pel *p1, *p2, *p3, *p4, *p5, *p6;
    int sum;
    int max_pel = (1 << sample_bit_depth) - 1;

    if (src[0] != src[-1]) {
        p1 = src + 1 * i_src;
        p2 = src;
        p3 = src + 2 * i_src;
        p4 = src;
        p5 = src + 3 * i_src;
        p6 = src;

        sum  = coef[0] * (p5[ 0] + p6[ 0]);
        sum += coef[1] * (p3[ 0] + p4[ 0]);
        sum += coef[2] * (p1[ 1] + p2[ 0]);
        sum += coef[3] * (p1[ 0] + p2[ 0]);
        sum += coef[4] * (p1[-1] + p2[ 1]);
        sum += coef[7] * (src [ 1] + src [-1]);
        sum += coef[6] * (src [ 2] + src [-2]);
        sum += coef[5] * (src [ 3] + src [-3]);
        sum += coef[8] * (src [ 0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }

    src += lcu_width - 1;
    dst += lcu_width - 1;

    if (src[0] != src[1]) {
        p1 = src + 1 * i_src;
        p2 = src;
        p3 = src + 2 * i_src;
        p4 = src;
        p5 = src + 3 * i_src;
        p6 = src;

        sum  = coef[0] * (p5[ 0] + p6[ 0]);
        sum += coef[1] * (p3[ 0] + p4[ 0]);
        sum += coef[2] * (p1[ 1] + p2[-1]);
        sum += coef[3] * (p1[ 0] + p2[ 0]);
        sum += coef[4] * (p1[-1] + p2[ 0]);
        sum += coef[7] * (src [ 1] + src [-1]);
        sum += coef[6] * (src [ 2] + src [-2]);
        sum += coef[5] * (src [ 3] + src [-3]);
        sum += coef[8] * (src [ 0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }

    /* last line */
    src -= lcu_width - 1;
    dst -= lcu_width - 1;
    src += ((lcu_height - 1) * i_src);
    dst += ((lcu_height - 1) * i_dst);

    if (src[0] != src[-1]) {
        p1 = src;
        p2 = src - 1 * i_src;
        p3 = src;
        p4 = src - 2 * i_src;
        p5 = src;
        p6 = src - 3 * i_src;

        sum  = coef[0] * (p5[ 0] + p6[ 0]);
        sum += coef[1] * (p3[ 0] + p4[ 0]);
        sum += coef[2] * (p1[ 1] + p2[-1]);
        sum += coef[3] * (p1[ 0] + p2[ 0]);
        sum += coef[4] * (p1[ 0] + p2[ 1]);
        sum += coef[7] * (src [ 1] + src [-1]);
        sum += coef[6] * (src [ 2] + src [-2]);
        sum += coef[5] * (src [ 3] + src [-3]);
        sum += coef[8] * (src [ 0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }

    src += lcu_width - 1;
    dst += lcu_width - 1;

    if (src[0] != src[1]) {
        p1 = src;
        p2 = src - 1 * i_src;
        p3 = src;
        p4 = src - 2 * i_src;
        p5 = src;
        p6 = src - 3 * i_src;

        sum  = coef[0] * (p5[ 0] + p6[ 0]);
        sum += coef[1] * (p3[ 0] + p4[ 0]);
        sum += coef[2] * (p1[ 0] + p2[-1]);
        sum += coef[3] * (p1[ 0] + p2[ 0]);
        sum += coef[4] * (p1[-1] + p2[ 1]);
        sum += coef[7] * (src [ 1] + src [-1]);
        sum += coef[6] * (src [ 2] + src [-2]);
        sum += coef[5] * (src [ 3] + src [-3]);
        sum += coef[8] * (src [ 0]);

        sum = (int)((sum + 32) >> 6);
        dst[0] = COM_CLIP3(0, max_pel, sum);
    }
}